

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixLockSharedMemory(unixFile *pDbFd,unixShmNode *pShmNode)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int rc;
  flock lock;
  sqlite3_int64 in_stack_ffffffffffffffb8;
  int iVar3;
  unixFile *pFile;
  int errcode;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  errcode = 0;
  pFile = (unixFile *)0xaaaaaaaa00000001;
  iVar2 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(in_RSI + 0x18),5,&stack0xffffffffffffffd8);
  if (iVar2 == 0) {
    if ((short)pFile == 2) {
      if (*(char *)(in_RSI + 0x22) == '\0') {
        iVar3 = unixShmSystemLock(pFile,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                                  (int)((ulong)in_RSI >> 0x20));
        if ((iVar3 == 0) && (iVar2 = robust_ftruncate(0,in_stack_ffffffffffffffb8), iVar2 != 0)) {
          iVar3 = unixLogErrorAtLine(errcode,(char *)pFile,in_RDI,(int)((ulong)in_RSI >> 0x20));
        }
      }
      else {
        *(undefined1 *)(in_RSI + 0x23) = 1;
        iVar3 = 0x508;
      }
    }
    else if ((short)pFile == 1) {
      iVar3 = 5;
    }
  }
  else {
    iVar3 = 0xf0a;
  }
  if (iVar3 == 0) {
    iVar3 = unixShmSystemLock(pFile,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                              (int)((ulong)in_RSI >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int unixLockSharedMemory(unixFile *pDbFd, unixShmNode *pShmNode){
  struct flock lock;
  int rc = SQLITE_OK;

  /* Use F_GETLK to determine the locks other processes are holding
  ** on the DMS byte. If it indicates that another process is holding
  ** a SHARED lock, then this process may also take a SHARED lock
  ** and proceed with opening the *-shm file.
  **
  ** Or, if no other process is holding any lock, then this process
  ** is the first to open it. In this case take an EXCLUSIVE lock on the
  ** DMS byte and truncate the *-shm file to zero bytes in size. Then
  ** downgrade to a SHARED lock on the DMS byte.
  **
  ** If another process is holding an EXCLUSIVE lock on the DMS byte,
  ** return SQLITE_BUSY to the caller (it will try again). An earlier
  ** version of this code attempted the SHARED lock at this point. But
  ** this introduced a subtle race condition: if the process holding
  ** EXCLUSIVE failed just before truncating the *-shm file, then this
  ** process might open and use the *-shm file without truncating it.
  ** And if the *-shm file has been corrupted by a power failure or
  ** system crash, the database itself may also become corrupt.  */
  lock.l_whence = SEEK_SET;
  lock.l_start = UNIX_SHM_DMS;
  lock.l_len = 1;
  lock.l_type = F_WRLCK;
  if( osFcntl(pShmNode->hShm, F_GETLK, &lock)!=0 ) {
    rc = SQLITE_IOERR_LOCK;
  }else if( lock.l_type==F_UNLCK ){
    if( pShmNode->isReadonly ){
      pShmNode->isUnlocked = 1;
      rc = SQLITE_READONLY_CANTINIT;
    }else{
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
      /* Do not use a blocking lock here. If the lock cannot be obtained
      ** immediately, it means some other connection is truncating the
      ** *-shm file. And after it has done so, it will not release its
      ** lock, but only downgrade it to a shared lock. So no point in
      ** blocking here. The call below to obtain the shared DMS lock may
      ** use a blocking lock. */
      int iSaveTimeout = pDbFd->iBusyTimeout;
      pDbFd->iBusyTimeout = 0;
#endif
      rc = unixShmSystemLock(pDbFd, F_WRLCK, UNIX_SHM_DMS, 1);
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
      pDbFd->iBusyTimeout = iSaveTimeout;
#endif
      /* The first connection to attach must truncate the -shm file.  We
      ** truncate to 3 bytes (an arbitrary small number, less than the
      ** -shm header size) rather than 0 as a system debugging aid, to
      ** help detect if a -shm file truncation is legitimate or is the work
      ** or a rogue process. */
      if( rc==SQLITE_OK && robust_ftruncate(pShmNode->hShm, 3) ){
        rc = unixLogError(SQLITE_IOERR_SHMOPEN,"ftruncate",pShmNode->zFilename);
      }
    }
  }else if( lock.l_type==F_WRLCK ){
    rc = SQLITE_BUSY;
  }

  if( rc==SQLITE_OK ){
    assert( lock.l_type==F_UNLCK || lock.l_type==F_RDLCK );
    rc = unixShmSystemLock(pDbFd, F_RDLCK, UNIX_SHM_DMS, 1);
  }
  return rc;
}